

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

bool __thiscall ON_Font::SetWindowsLogfontName(ON_Font *this,wchar_t *windows_logfont_name)

{
  ON_wString *this_00;
  bool bVar1;
  uchar uVar2;
  ON_Font *src;
  wchar_t *pwVar3;
  ON_wString family_name;
  
  bVar1 = IsValidFaceName(windows_logfont_name);
  if (!bVar1) {
    return false;
  }
  ON_ManagedFonts::InstalledFonts();
  src = ON_FontList::Internal_FromNames
                  (&ON_ManagedFonts::List.m_installed_fonts,(wchar_t *)0x0,windows_logfont_name,
                   (wchar_t *)0x0,(wchar_t *)0x0,Normal,Medium,Upright,false,false,false,false,false
                   ,0.0);
  if (src == (ON_Font *)0x0) {
    uVar2 = WindowsLogfontCharSetFromFaceName(windows_logfont_name);
    FamilyNameFromDirtyName((ON_Font *)&family_name,windows_logfont_name);
    this_00 = &this->m_loc_windows_logfont_name;
    pwVar3 = ON_wString::operator_cast_to_wchar_t_(this_00);
    bVar1 = ON_wString::EqualOrdinal(windows_logfont_name,pwVar3,false);
    if (((((!bVar1) ||
          (bVar1 = ::operator==(&family_name,&this->m_loc_family_name),
          !bVar1 || this->m_font_weight != Normal)) || (this->m_font_style != Upright)) ||
        ((this->m_font_stretch != Medium || (uVar2 != this->m_logfont_charset)))) ||
       (bVar1 = true, this->m_font_origin != Unknown)) {
      bVar1 = ModificationPermitted
                        (this,"",
                         "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                         ,0x2d45);
      if (bVar1) {
        bVar1 = ON_wString::EqualOrdinal(L"Arial",windows_logfont_name,true);
        if (bVar1) {
          pwVar3 = L"ArialMT";
LAB_00488198:
          ON_wString::operator=(&this->m_loc_postscript_name,pwVar3);
        }
        else {
          bVar1 = ON_wString::EqualOrdinal(L"Segoe UI",windows_logfont_name,true);
          if ((bVar1) ||
             (bVar1 = ON_wString::EqualOrdinal(L"SegoeUI",windows_logfont_name,true), bVar1)) {
            pwVar3 = L"SegoeUI";
            goto LAB_00488198;
          }
          bVar1 = ON_wString::EqualOrdinal(L"Helvetica Neue",windows_logfont_name,true);
          if ((bVar1) ||
             (bVar1 = ON_wString::EqualOrdinal(L"HelveticaNeue",windows_logfont_name,true), bVar1))
          {
            pwVar3 = L"HelveticaNeue";
            goto LAB_00488198;
          }
          pwVar3 = L"Helvetica";
          bVar1 = ON_wString::EqualOrdinal(L"Helvetica",windows_logfont_name,true);
          if (bVar1) goto LAB_00488198;
          ON_wString::operator=(&this->m_loc_postscript_name,&ON_wString::EmptyString);
        }
        ON_wString::operator=(&this->m_en_postscript_name,&this->m_loc_postscript_name);
        ON_wString::operator=(&this->m_loc_family_name,&family_name);
        ON_wString::operator=(&this->m_en_family_name,&this->m_loc_family_name);
        ON_wString::operator=(this_00,windows_logfont_name);
        ON_wString::operator=(&this->m_en_windows_logfont_name,this_00);
        this->m_logfont_charset = uVar2;
        this->m_font_weight = Normal;
        this->m_font_style = Upright;
        this->m_font_stretch = Medium;
        this->m_font_origin = Unknown;
        ON_wString::~ON_wString(&family_name);
        goto LAB_00488082;
      }
      bVar1 = false;
    }
    ON_wString::~ON_wString(&family_name);
  }
  else {
    operator=(this,src);
LAB_00488082:
    Internal_AfterModification(this);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool ON_Font::SetWindowsLogfontName(
  const wchar_t* windows_logfont_name
  )
{
  if (false == ON_Font::IsValidFaceName(windows_logfont_name))
    return false;

  const ON_Font::Weight font_weight = ON_Font::Weight::Normal;
  const ON_Font::Style font_style = ON_Font::Style::Upright;
  const ON_Font::Stretch font_stretch = ON_Font::Stretch::Medium;

  const ON_Font* installed_font =
    ON_Font::InstalledFontList().FromNames(
      nullptr,
      windows_logfont_name,
      nullptr,
      nullptr,
      font_weight,
      font_stretch,
      font_style,
      false,
      false
    );

  if (nullptr != installed_font)
  {
    *this = *installed_font;
  }
  else
  {
    const unsigned char logfont_charset = ON_Font::WindowsLogfontCharSetFromFaceName(windows_logfont_name);

    const ON_wString family_name = ON_Font::FamilyNameFromDirtyName(windows_logfont_name);

    if (
      ON_wString::EqualOrdinal(windows_logfont_name, m_loc_windows_logfont_name, false)
      && family_name == m_loc_family_name
      && font_weight == m_font_weight
      && font_style == m_font_style
      && font_stretch == m_font_stretch
      && logfont_charset == m_logfont_charset
      && ON_Font::Origin::Unknown == m_font_origin
      )
    {
      return true;
    }

    if (false == ON_FONT_MODIFICATION_PERMITTED)
      return false;

    // TODO - better support for generating PostScript names from LOGFONT.lfFaceNames
    //  This code at least handles the 4 most common names passed to this setter.
    if (ON_wString::EqualOrdinal(L"Arial", windows_logfont_name, true))
      m_loc_postscript_name = L"ArialMT";
    else if (ON_wString::EqualOrdinal(L"Segoe UI", windows_logfont_name, true)
      || ON_wString::EqualOrdinal(L"SegoeUI", windows_logfont_name, true))
    {
      m_loc_postscript_name = L"SegoeUI";
    }
    else if (ON_wString::EqualOrdinal(L"Helvetica Neue", windows_logfont_name, true)
      || ON_wString::EqualOrdinal(L"HelveticaNeue", windows_logfont_name, true))
      m_loc_postscript_name = L"HelveticaNeue";
    else if (ON_wString::EqualOrdinal(L"Helvetica", windows_logfont_name, true))
      m_loc_postscript_name = L"Helvetica";
    else
      m_loc_postscript_name = ON_wString::EmptyString;

    m_en_postscript_name = m_loc_postscript_name;

    m_loc_family_name = family_name;
    m_en_family_name = m_loc_family_name;

    m_loc_windows_logfont_name = windows_logfont_name;
    m_en_windows_logfont_name = m_loc_windows_logfont_name;

    m_logfont_charset = logfont_charset;
    m_font_weight = font_weight;
    m_font_style = font_style;
    m_font_stretch = font_stretch;
    m_font_origin = ON_Font::Origin::Unknown;
  }
  
  Internal_AfterModification();

  return true;
}